

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_local_array_statement_t *stmt)

{
  uint uVar1;
  typed_var_expression_t *ptVar2;
  pointer plVar3;
  variable_id_t vVar4;
  iterator iVar5;
  vector<long,_std::allocator<long>_> *this_00;
  ulong uVar6;
  ulong local_28;
  
  ptVar2 = typed_local_array_statement_t::variable(stmt);
  vVar4 = ptVar2->_id;
  ptVar2 = typed_local_array_statement_t::variable(stmt);
  uVar1 = (**(code **)(*(long *)&(ptVar2->super_typed_lvalue_expression_t).super_typed_expression_t
                      + 0x38))(ptVar2);
  if (uVar1 != 0) {
    uVar6 = (ulong)uVar1;
    do {
      local_28 = 5;
      this_00 = (this->_bytecode_back_inserter).container;
      iVar5._M_current =
           (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (iVar5._M_current == plVar3) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (this_00,iVar5,(long *)&local_28);
        this_00 = (this->_bytecode_back_inserter).container;
        iVar5._M_current =
             (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar5._M_current = 5;
        iVar5._M_current = iVar5._M_current + 1;
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar5._M_current;
      }
      local_28 = (ulong)vVar4;
      if (iVar5._M_current == plVar3) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (this_00,iVar5,(long *)&local_28);
        this_00 = (this->_bytecode_back_inserter).container;
        iVar5._M_current =
             (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar5._M_current = local_28;
        iVar5._M_current = iVar5._M_current + 1;
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar5._M_current;
      }
      local_28 = 5;
      if (iVar5._M_current == plVar3) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (this_00,iVar5,(long *)&local_28);
        this_00 = (this->_bytecode_back_inserter).container;
        iVar5._M_current =
             (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar5._M_current = 5;
        iVar5._M_current = iVar5._M_current + 1;
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar5._M_current;
      }
      local_28 = 0;
      if (iVar5._M_current == plVar3) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (this_00,iVar5,(long *)&local_28);
        this_00 = (this->_bytecode_back_inserter).container;
        iVar5._M_current =
             (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        plVar3 = (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar5._M_current = 0;
        iVar5._M_current = iVar5._M_current + 1;
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar5._M_current;
      }
      local_28 = 0x1c;
      if (iVar5._M_current == plVar3) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (this_00,iVar5,(long *)&local_28);
      }
      else {
        *iVar5._M_current = 0x1c;
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar5._M_current + 1;
      }
      vVar4 = vVar4 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_local_array_statement_t const & stmt)
  {
    tchecker::variable_size_t id = stmt.variable().id();
    tchecker::variable_size_t asize = stmt.variable().size();

    for (tchecker::variable_size_t i = 0; i < asize; i++) {
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = id + i;
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = 0;
      _bytecode_back_inserter = VM_INIT_FRAME;
    }
  }